

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  PromiseArena *pPVar1;
  PromiseArena *pPVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  OwnPromiseNode OVar5;
  void *pvVar6;
  _func_int **in_RSI;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_60;
  OwnPromiseNode local_58;
  SourceLocation local_50;
  _func_int **local_38;
  
  if (in_RSI[0x15] == in_RSI[0x11]) {
    *(undefined1 *)((long)in_RSI + 0x6c) = 0;
    if ((*(int *)(in_RSI + 0xd) == 0) && (in_RSI[0xc] != (_func_int *)0x0)) {
      (**(code **)(*(long *)in_RSI[0xc] + 0x10))(in_RSI[0xc],&local_50);
      p_Var3 = in_RSI[0xb];
      p_Var4 = in_RSI[0xc];
      in_RSI[0xb] = (_func_int *)0x0;
      in_RSI[0xc] = (_func_int *)0x0;
      if (p_Var4 != (_func_int *)0x0) {
        (*(code *)**(undefined8 **)p_Var3)(p_Var3,p_Var4 + *(long *)(*(long *)p_Var4 + -0x10));
      }
    }
    kj::_::readyNow();
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)local_50.fileName;
  }
  else {
    pPVar1 = *(PromiseArena **)(in_RSI[0x11] + 0x10);
    (**(code **)(*(long *)in_RSI[1] + 8))(&local_60,in_RSI[1],pPVar1);
    OVar5.ptr = local_60.ptr;
    pPVar2 = ((local_60.ptr)->super_PromiseArenaMember).arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_60.ptr - (long)pPVar2) < 0x30) {
      pvVar6 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6099:38)>
                 ::anon_class_16_2_3fe63c88_for_func::operator());
      *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_007041d0;
      *(_func_int ***)((long)pvVar6 + 0x3f0) = in_RSI;
      *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPVar1;
      *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
    }
    else {
      ((local_60.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_60.ptr + -3);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6099:38)>
                 ::anon_class_16_2_3fe63c88_for_func::operator());
      OVar5.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_007041d0;
      OVar5.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = in_RSI;
      OVar5.ptr[-1].super_PromiseArenaMember.arena = pPVar1;
      OVar5.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
    }
    local_50.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_50.function = "then";
    local_50.lineNumber = 0x58b;
    local_50.columnNumber = 0x4c;
    local_58.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_38,&local_58,&local_50);
    OVar5.ptr = local_58.ptr;
    (this->super_HttpClient)._vptr_HttpClient = local_38;
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
    }
    OVar5.ptr = local_60.ptr;
    if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_SOME(f, drainedFulfiller) {
          f->fulfill();
          drainedFulfiller = kj::none;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }